

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

void Gia_ManCleanupRemap(Gia_Man_t *p,Gia_Man_t *pGia)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  long lVar4;
  uint uVar5;
  
  iVar1 = p->nObjs;
  if (1 < (long)iVar1) {
    pGVar3 = p->pObjs;
    lVar4 = 0;
    do {
      uVar2 = *(uint *)((long)&pGVar3[1].Value + lVar4);
      if (uVar2 != 0xffffffff) {
        if ((int)uVar2 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        if (pGia->nObjs <= (int)(uVar2 >> 1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar5 = pGia->pObjs[uVar2 >> 1].Value;
        if (uVar5 == 0xffffffff) {
          uVar5 = 0xffffffff;
        }
        else {
          if ((int)uVar5 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf5,"int Abc_LitNotCond(int, int)");
          }
          uVar5 = uVar5 ^ uVar2 & 1;
        }
        *(uint *)((long)&pGVar3[1].Value + lVar4) = uVar5;
      }
      lVar4 = lVar4 + 0xc;
    } while ((long)iVar1 * 0xc + -0xc != lVar4);
  }
  return;
}

Assistant:

void Gia_ManCleanupRemap( Gia_Man_t * p, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj, * pObjGia;
    int i, iPrev;
    Gia_ManForEachObj1( p, pObj, i )
    {
        iPrev = Gia_ObjValue(pObj);
        if ( iPrev == ~0 )
            continue;
        pObjGia = Gia_ManObj( pGia, Abc_Lit2Var(iPrev) );
        if ( pObjGia->Value == ~0 )
            Gia_ObjSetValue( pObj, pObjGia->Value ); 
        else
            Gia_ObjSetValue( pObj, Abc_LitNotCond(pObjGia->Value, Abc_LitIsCompl(iPrev)) );
    }
}